

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O2

string * __thiscall
flatbuffers::Parser::ConformTo_abi_cxx11_(string *__return_storage_ptr__,Parser *this,Parser *base)

{
  StructDef *name;
  FieldDef *pFVar1;
  EnumDef *name_00;
  EnumVal *name_01;
  bool bVar2;
  pointer ppSVar3;
  StructDef *pSVar4;
  pointer ppFVar5;
  iterator iVar6;
  FieldDef *pFVar7;
  EnumDef *pEVar8;
  EnumVal *pEVar9;
  pointer ppFVar10;
  pointer ppEVar11;
  Parser *this_00;
  char *pcVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  string *this_02;
  SymbolTable<flatbuffers::FieldDef> *pSVar13;
  FieldDef *field_base;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> qualified_field_name;
  string qualified_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> qualified_field_base;
  set<flatbuffers::FieldDef_*,_std::less<flatbuffers::FieldDef_*>,_std::allocator<flatbuffers::FieldDef_*>_>
  renamed_fields;
  FieldDef *local_150;
  Parser *local_148;
  SymbolTable<flatbuffers::FieldDef> *local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  Parser *local_118;
  string local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  undefined1 local_d0 [32];
  _Base_ptr local_b0;
  size_t local_a8;
  SymbolTable<flatbuffers::FieldDef> *local_a0;
  pointer local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  ppSVar3 = (this->structs_).vec.
            super__Vector_base<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  local_148 = base;
  local_118 = this;
  while (ppSVar3 !=
         (local_118->structs_).vec.
         super__Vector_base<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>.
         _M_impl.super__Vector_impl_data._M_finish) {
    name = *ppSVar3;
    local_98 = ppSVar3;
    Namespace::GetFullyQualifiedName
              (&local_110,(name->super_Definition).defined_namespace,(string *)name,1000);
    pSVar4 = LookupStruct(base,&local_110);
    if (pSVar4 == (StructDef *)0x0) {
      std::__cxx11::string::~string((string *)&local_110);
    }
    else {
      local_d0._8_4_ = _S_red;
      local_d0._16_8_ = (_Base_ptr)0x0;
      local_d0._24_8_ = local_d0 + 8;
      local_a8 = 0;
      local_a0 = &name->fields;
      local_140 = &pSVar4->fields;
      local_b0 = (_Base_ptr)local_d0._24_8_;
      for (ppFVar10 = (name->fields).vec.
                      super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                      ._M_impl.super__Vector_impl_data._M_start; pSVar13 = local_a0,
          ppFVar10 !=
          (name->fields).vec.
          super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
          _M_impl.super__Vector_impl_data._M_finish; ppFVar10 = ppFVar10 + 1) {
        pFVar1 = *ppFVar10;
        local_150 = SymbolTable<flatbuffers::FieldDef>::Lookup(local_140,(string *)pFVar1);
        std::operator+(&local_f0,&local_110,".");
        std::operator+(&local_138,&local_f0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pFVar1);
        std::__cxx11::string::~string((string *)&local_f0);
        if (local_150 != (FieldDef *)0x0) {
          if ((pFVar1->value).offset == (local_150->value).offset) {
            bVar2 = std::operator!=(&(pFVar1->value).constant,&(local_150->value).constant);
            if (bVar2) {
              pcVar12 = "defaults differ for field: ";
            }
            else {
              bVar2 = EqualByName(&(pFVar1->value).type,&(local_150->value).type);
              if (bVar2) {
                if (pFVar1->offset64 == local_150->offset64) goto LAB_00118e51;
                pcVar12 = "offset types differ for field: ";
              }
              else {
                pcVar12 = "types differ for field: ";
              }
            }
          }
          else {
            pcVar12 = "offsets differ for field: ";
          }
          std::operator+(__return_storage_ptr__,pcVar12,&local_138);
LAB_00118f29:
          this_01 = &local_138;
          goto LAB_00118f2e;
        }
        ppFVar5 = (pSVar4->fields).vec.
                  super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        do {
          if (ppFVar5 ==
              (pSVar4->fields).vec.
              super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
              _M_impl.super__Vector_impl_data._M_finish) goto LAB_00118e51;
          local_150 = *ppFVar5;
          ppFVar5 = ppFVar5 + 1;
        } while ((pFVar1->value).offset != (local_150->value).offset);
        std::
        _Rb_tree<flatbuffers::FieldDef*,flatbuffers::FieldDef*,std::_Identity<flatbuffers::FieldDef*>,std::less<flatbuffers::FieldDef*>,std::allocator<flatbuffers::FieldDef*>>
        ::_M_insert_unique<flatbuffers::FieldDef*const&>
                  ((_Rb_tree<flatbuffers::FieldDef*,flatbuffers::FieldDef*,std::_Identity<flatbuffers::FieldDef*>,std::less<flatbuffers::FieldDef*>,std::allocator<flatbuffers::FieldDef*>>
                    *)local_d0,&local_150);
        bVar2 = EqualByName(&(pFVar1->value).type,&(local_150->value).type);
        if (!bVar2) {
          std::operator+(&local_90,&local_110,".");
          std::operator+(&local_f0,&local_90,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_150);
          std::__cxx11::string::~string((string *)&local_90);
          std::operator+(&local_70,"field renamed to different type: ",&local_138);
          std::operator+(&local_50,&local_70," (renamed from ");
          std::operator+(&local_90,&local_50,&local_f0);
          std::operator+(__return_storage_ptr__,&local_90,")");
          std::__cxx11::string::~string((string *)&local_90);
          std::__cxx11::string::~string((string *)&local_50);
          std::__cxx11::string::~string((string *)&local_70);
          std::__cxx11::string::~string((string *)&local_f0);
          goto LAB_00118f29;
        }
LAB_00118e51:
        std::__cxx11::string::~string((string *)&local_138);
      }
      for (ppFVar10 = (pSVar4->fields).vec.
                      super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          ppFVar10 !=
          (pSVar4->fields).vec.
          super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
          _M_impl.super__Vector_impl_data._M_finish; ppFVar10 = ppFVar10 + 1) {
        pFVar1 = *ppFVar10;
        local_138._M_dataplus._M_p = (pointer)pFVar1;
        iVar6 = std::
                _Rb_tree<flatbuffers::FieldDef_*,_flatbuffers::FieldDef_*,_std::_Identity<flatbuffers::FieldDef_*>,_std::less<flatbuffers::FieldDef_*>,_std::allocator<flatbuffers::FieldDef_*>_>
                ::find((_Rb_tree<flatbuffers::FieldDef_*,_flatbuffers::FieldDef_*,_std::_Identity<flatbuffers::FieldDef_*>,_std::less<flatbuffers::FieldDef_*>,_std::allocator<flatbuffers::FieldDef_*>_>
                        *)local_d0,(key_type *)&local_138);
        if ((iVar6._M_node == (_Base_ptr)(local_d0 + 8)) &&
           (pFVar7 = SymbolTable<flatbuffers::FieldDef>::Lookup(pSVar13,(string *)pFVar1),
           pFVar7 == (FieldDef *)0x0)) {
          std::operator+(&local_f0,"field deleted: ",&local_110);
          std::operator+(&local_138,&local_f0,".");
          std::operator+(__return_storage_ptr__,&local_138,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pFVar1
                        );
          std::__cxx11::string::~string((string *)&local_138);
          this_01 = &local_f0;
LAB_00118f2e:
          std::__cxx11::string::~string((string *)this_01);
          std::
          _Rb_tree<flatbuffers::FieldDef_*,_flatbuffers::FieldDef_*,_std::_Identity<flatbuffers::FieldDef_*>,_std::less<flatbuffers::FieldDef_*>,_std::allocator<flatbuffers::FieldDef_*>_>
          ::~_Rb_tree((_Rb_tree<flatbuffers::FieldDef_*,_flatbuffers::FieldDef_*,_std::_Identity<flatbuffers::FieldDef_*>,_std::less<flatbuffers::FieldDef_*>,_std::allocator<flatbuffers::FieldDef_*>_>
                       *)local_d0);
          this_02 = &local_110;
          goto LAB_00118f45;
        }
      }
      std::
      _Rb_tree<flatbuffers::FieldDef_*,_flatbuffers::FieldDef_*,_std::_Identity<flatbuffers::FieldDef_*>,_std::less<flatbuffers::FieldDef_*>,_std::allocator<flatbuffers::FieldDef_*>_>
      ::~_Rb_tree((_Rb_tree<flatbuffers::FieldDef_*,_flatbuffers::FieldDef_*,_std::_Identity<flatbuffers::FieldDef_*>,_std::less<flatbuffers::FieldDef_*>,_std::allocator<flatbuffers::FieldDef_*>_>
                   *)local_d0);
      std::__cxx11::string::~string((string *)&local_110);
      base = local_148;
    }
    ppSVar3 = local_98 + 1;
  }
  pSVar13 = (SymbolTable<flatbuffers::FieldDef> *)
            (local_118->enums_).vec.
            super__Vector_base<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  this_00 = (Parser *)&base->enums_;
  local_148 = this_00;
  do {
    if (pSVar13 ==
        (SymbolTable<flatbuffers::FieldDef> *)
        (local_118->enums_).vec.
        super__Vector_base<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"",(allocator<char> *)local_d0);
      return __return_storage_ptr__;
    }
    name_00 = *(EnumDef **)&(pSVar13->dict)._M_t._M_impl;
    Namespace::GetFullyQualifiedName
              ((string *)local_d0,(name_00->super_Definition).defined_namespace,(string *)name_00,
               1000);
    pEVar8 = SymbolTable<flatbuffers::EnumDef>::Lookup
                       ((SymbolTable<flatbuffers::EnumDef> *)this_00,(string *)local_d0);
    if (pEVar8 != (EnumDef *)0x0) {
      local_140 = pSVar13;
      for (ppEVar11 = (name_00->vals).vec.
                      super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          ppEVar11 !=
          (name_00->vals).vec.
          super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>.
          _M_impl.super__Vector_impl_data._M_finish; ppEVar11 = ppEVar11 + 1) {
        name_01 = *ppEVar11;
        pEVar9 = SymbolTable<flatbuffers::EnumVal>::Lookup(&pEVar8->vals,&name_01->name);
        if ((pEVar9 != (EnumVal *)0x0) && (name_01->value != pEVar9->value)) {
          std::operator+(__return_storage_ptr__,"values differ for enum: ",&name_01->name);
          goto LAB_00119177;
        }
      }
      this_00 = local_148;
      pSVar13 = local_140;
      if ((pEVar8->underlying_type).base_type != (name_00->underlying_type).base_type) {
        pcVar12 = "enum: ";
        if (name_00->is_union != false) {
          pcVar12 = "union: ";
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_138,pcVar12,(allocator<char> *)&local_f0);
        std::operator+(&local_110,"underlying type differ for ",&local_138);
        std::operator+(__return_storage_ptr__,&local_110,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0
                      );
        std::__cxx11::string::~string((string *)&local_110);
        std::__cxx11::string::~string((string *)&local_138);
LAB_00119177:
        this_02 = (string *)local_d0;
LAB_00118f45:
        std::__cxx11::string::~string((string *)this_02);
        return __return_storage_ptr__;
      }
    }
    std::__cxx11::string::~string((string *)local_d0);
    pSVar13 = (SymbolTable<flatbuffers::FieldDef> *)
              &(pSVar13->dict)._M_t._M_impl.super__Rb_tree_header;
  } while( true );
}

Assistant:

std::string Parser::ConformTo(const Parser &base) {
  for (auto sit = structs_.vec.begin(); sit != structs_.vec.end(); ++sit) {
    auto &struct_def = **sit;
    auto qualified_name =
        struct_def.defined_namespace->GetFullyQualifiedName(struct_def.name);
    auto struct_def_base = base.LookupStruct(qualified_name);
    if (!struct_def_base) continue;
    std::set<FieldDef *> renamed_fields;
    for (auto fit = struct_def.fields.vec.begin();
         fit != struct_def.fields.vec.end(); ++fit) {
      auto &field = **fit;
      auto field_base = struct_def_base->fields.Lookup(field.name);
      const auto qualified_field_name = qualified_name + "." + field.name;
      if (field_base) {
        if (field.value.offset != field_base->value.offset) {
          return "offsets differ for field: " + qualified_field_name;
        }
        if (field.value.constant != field_base->value.constant) {
          return "defaults differ for field: " + qualified_field_name;
        }
        if (!EqualByName(field.value.type, field_base->value.type)) {
          return "types differ for field: " + qualified_field_name;
        }
        if (field.offset64 != field_base->offset64) {
          return "offset types differ for field: " + qualified_field_name;
        }
      } else {
        // Doesn't have to exist, deleting fields is fine.
        // But we should check if there is a field that has the same offset
        // but is incompatible (in the case of field renaming).
        for (auto fbit = struct_def_base->fields.vec.begin();
             fbit != struct_def_base->fields.vec.end(); ++fbit) {
          field_base = *fbit;
          if (field.value.offset == field_base->value.offset) {
            renamed_fields.insert(field_base);
            if (!EqualByName(field.value.type, field_base->value.type)) {
              const auto qualified_field_base =
                  qualified_name + "." + field_base->name;
              return "field renamed to different type: " +
                     qualified_field_name + " (renamed from " +
                     qualified_field_base + ")";
            }
            break;
          }
        }
      }
    }
    // deletion of trailing fields are not allowed
    for (auto fit = struct_def_base->fields.vec.begin();
         fit != struct_def_base->fields.vec.end(); ++fit) {
      auto &field_base = **fit;
      // not a renamed field
      if (renamed_fields.find(&field_base) == renamed_fields.end()) {
        auto field = struct_def.fields.Lookup(field_base.name);
        if (!field) {
          return "field deleted: " + qualified_name + "." + field_base.name;
        }
      }
    }
  }

  for (auto eit = enums_.vec.begin(); eit != enums_.vec.end(); ++eit) {
    auto &enum_def = **eit;
    auto qualified_name =
        enum_def.defined_namespace->GetFullyQualifiedName(enum_def.name);
    auto enum_def_base = base.enums_.Lookup(qualified_name);
    if (!enum_def_base) continue;
    for (auto evit = enum_def.Vals().begin(); evit != enum_def.Vals().end();
         ++evit) {
      auto &enum_val = **evit;
      auto enum_val_base = enum_def_base->Lookup(enum_val.name);
      if (enum_val_base) {
        if (enum_val != *enum_val_base)
          return "values differ for enum: " + enum_val.name;
      }
    }
    // Check underlying type changes
    if (enum_def_base->underlying_type.base_type != enum_def.underlying_type.base_type) {
      return "underlying type differ for " + std::string(enum_def.is_union ? "union: " : "enum: ") + qualified_name;
    }
  }
  return "";
}